

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::csdashroll(Forth *this)

{
  uint Value;
  uint Value_00;
  uint local_1c;
  uint i;
  uint newTop;
  uint index;
  Forth *this_local;
  
  requireDStackDepth(this,1,"CS-ROLL");
  local_1c = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (local_1c != 0) {
    requireCStackDepth(this,(ulong)(local_1c + 1),"CS-ROLL");
    Value = ForthStack<unsigned_int>::getTop(&this->controlStackIf_Begin,(ulong)local_1c);
    for (; local_1c != 0; local_1c = local_1c - 1) {
      Value_00 = ForthStack<unsigned_int>::getTop(&this->controlStackIf_Begin,(ulong)(local_1c - 1))
      ;
      ForthStack<unsigned_int>::setTop(&this->controlStackIf_Begin,(ulong)local_1c,Value_00);
    }
    ForthStack<unsigned_int>::setTop(&this->controlStackIf_Begin,Value);
  }
  return;
}

Assistant:

void csdashroll() {
			REQUIRE_DSTACK_DEPTH(1, "CS-ROLL");
			auto index = dStack.getTop(); pop();
			if(index>0){
			REQUIRE_CSTACK_DEPTH(index+1, "CS-ROLL");
			 auto newTop=controlStackIf_Begin.getTop(index);
			 for(auto i=index;i>0;--i){
			  controlStackIf_Begin.setTop(i,controlStackIf_Begin.getTop(i-1));
			 }
			 controlStackIf_Begin.setTop(newTop);
			}
			//auto cell = controlStackLoops.getTop(); controlStackLoops.pop();
		}